

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O1

PaError PaUnixThread_New(PaUnixThread *self,_func_void_ptr_void_ptr *threadFunc,void *threadArg,
                        PaTime waitForChild,int rtSched)

{
  pthread_cond_t *__cond;
  PaUnixMutex *__mutex;
  double dVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  PaError PVar5;
  char *pcVar6;
  double dVar7;
  int policy;
  sched_param spm;
  pthread_attr_t attr;
  timespec local_88;
  double local_78;
  sched_param local_6c;
  pthread_attr_t local_68;
  
  *(undefined8 *)((long)&self->cond + 0x20) = 0;
  *(undefined8 *)((long)&self->cond + 0x28) = 0;
  *(undefined8 *)((long)&self->cond + 0x10) = 0;
  *(undefined8 *)((long)&self->cond + 0x18) = 0;
  (self->cond).__align = 0;
  (self->cond).__data.__g1_start.__value64 = 0;
  (self->mtx).mtx.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (self->mtx).mtx.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(self->mtx).mtx + 8) = 0;
  *(undefined8 *)((long)&(self->mtx).mtx + 0x10) = 0;
  *(undefined8 *)&self->locked = 0;
  (self->mtx).mtx.__align = 0;
  self->thread = 0;
  self->parentWaiting = 0;
  self->stopRequested = 0;
  *(undefined8 *)&self->stopRequest = 0;
  __cond = &self->cond;
  __mutex = &self->mtx;
  PaUnixMutex_Initialize(__mutex);
  paUtilErr_ = pthread_cond_init((pthread_cond_t *)__cond,(pthread_condattr_t *)0x0);
  if (paUtilErr_ != 0) {
    __assert_fail("0 == paUtilErr_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/os/unix/pa_unix_util.c"
                  ,0x115,
                  "PaError PaUnixThread_New(PaUnixThread *, void *(*)(void *), void *, PaTime, int)"
                 );
  }
  self->parentWaiting = -(uint)(waitForChild != 0.0) & 1;
  iVar3 = pthread_attr_init(&local_68);
  if (iVar3 == 0) {
    iVar3 = pthread_attr_setscope(&local_68,0);
    if (iVar3 == 0) {
      iVar3 = pthread_create(&self->thread,&local_68,(__start_routine *)threadFunc,threadArg);
      if (iVar3 == 0) {
        if (rtSched != 0) {
          local_88.tv_sec = CONCAT44(local_88.tv_sec._4_4_,1);
          if (self == (PaUnixThread *)0x0) {
            __assert_fail("self",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/os/unix/pa_unix_util.c"
                          ,0xfc,"PaError BoostPriority(PaUnixThread *)");
          }
          PVar5 = 1;
          iVar3 = pthread_setschedparam(self->thread,1,(sched_param *)&local_88);
          if (iVar3 != 0) {
            piVar4 = __errno_location();
            PVar5 = 0;
            if (*piVar4 != 1) {
              bVar2 = false;
              PaUtil_DebugPrint(
                               "Expression \'errno == EPERM\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/os/unix/pa_unix_util.c\', line: 256\n"
                               );
              paUtilErr_ = -0x2702;
              PaUtil_DebugPrint(
                               "Expression \'BoostPriority( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/os/unix/pa_unix_util.c\', line: 345\n"
                               );
              PVar5 = paUtilErr_;
              goto LAB_0010d9b0;
            }
          }
          paUtilErr_ = PVar5;
          pthread_getschedparam(self->thread,(int *)&local_88,&local_6c);
        }
        if (self->parentWaiting == 0) {
          return 0;
        }
        paUtilErr_ = PaUnixMutex_Lock(__mutex);
        if (paUtilErr_ < 0) {
          pcVar6 = 
          "Expression \'PaUnixMutex_Lock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/os/unix/pa_unix_util.c\', line: 361\n"
          ;
LAB_0010d977:
          bVar2 = false;
          PaUtil_DebugPrint(pcVar6);
          PVar5 = paUtilErr_;
        }
        else {
          iVar3 = 0;
          gettimeofday((timeval *)&local_88,(__timezone_ptr_t)0x0);
          if (self->parentWaiting != 0) {
            local_78 = (double)local_88.tv_nsec * 1e-06 + (double)local_88.tv_sec + waitForChild;
            dVar1 = floor(local_78);
            dVar7 = local_78 - dVar1;
            do {
              if (waitForChild <= 0.0) {
                iVar3 = pthread_cond_wait((pthread_cond_t *)__cond,(pthread_mutex_t *)__mutex);
              }
              else {
                local_88.tv_sec = (long)dVar1;
                local_88.tv_nsec = (long)(dVar7 * 1000000000.0);
                iVar3 = pthread_cond_timedwait
                                  ((pthread_cond_t *)__cond,(pthread_mutex_t *)__mutex,&local_88);
              }
            } while ((self->parentWaiting != 0) && (iVar3 == 0));
          }
          paUtilErr_ = PaUnixMutex_Unlock(__mutex);
          if (paUtilErr_ < 0) {
            pcVar6 = 
            "Expression \'PaUnixMutex_Unlock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/os/unix/pa_unix_util.c\', line: 381\n"
            ;
            goto LAB_0010d977;
          }
          if (iVar3 == 0) {
            bVar2 = true;
            PVar5 = 0;
          }
          else {
            if (iVar3 == 0x6e) {
              paUtilErr_ = -0x2703;
              pcVar6 = 
              "Expression \'paTimedOut\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/os/unix/pa_unix_util.c\', line: 387\n"
              ;
              goto LAB_0010d977;
            }
            bVar2 = false;
            PaUtil_DebugPrint(
                             "Expression \'!res || ETIMEDOUT == res\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/os/unix/pa_unix_util.c\', line: 383\n"
                             );
            PVar5 = -0x2702;
          }
        }
        if (bVar2) {
          return PVar5;
        }
        bVar2 = false;
        goto LAB_0010d9b0;
      }
      pcVar6 = 
      "Expression \'!pthread_create( &self->thread, &attr, threadFunc, threadArg )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/os/unix/pa_unix_util.c\', line: 305\n"
      ;
    }
    else {
      pcVar6 = 
      "Expression \'!pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/os/unix/pa_unix_util.c\', line: 303\n"
      ;
    }
  }
  else {
    pcVar6 = 
    "Expression \'!pthread_attr_init( &attr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/os/unix/pa_unix_util.c\', line: 301\n"
    ;
  }
  PaUtil_DebugPrint(pcVar6);
  PVar5 = -0x2702;
  bVar2 = true;
LAB_0010d9b0:
  if (!bVar2) {
    PaUnixThread_Terminate(self,0,(PaError *)0x0);
  }
  return PVar5;
}

Assistant:

PaError PaUnixThread_New( PaUnixThread* self, void* (*threadFunc)( void* ), void* threadArg, PaTime waitForChild,
        int rtSched )
{
    PaError result = paNoError;
    pthread_attr_t attr;
    int started = 0;

    memset( self, 0, sizeof (PaUnixThread) );
    PaUnixMutex_Initialize( &self->mtx );
    PA_ASSERT_CALL( pthread_cond_init( &self->cond, NULL ), 0 );

    self->parentWaiting = 0 != waitForChild;

    /* Spawn thread */

/* Temporarily disabled since we should test during configuration for presence of required mman.h header */
#if 0
#if defined _POSIX_MEMLOCK && (_POSIX_MEMLOCK != -1)
    if( rtSched )
    {
        if( mlockall( MCL_CURRENT | MCL_FUTURE ) < 0 )
        {
            int savedErrno = errno;             /* In case errno gets overwritten */
            assert( savedErrno != EINVAL );     /* Most likely a programmer error */
            PA_UNLESS( (savedErrno == EPERM), paInternalError );
            PA_DEBUG(( "%s: Failed locking memory\n", __FUNCTION__ ));
        }
        else
            PA_DEBUG(( "%s: Successfully locked memory\n", __FUNCTION__ ));
    }
#endif
#endif

    PA_UNLESS( !pthread_attr_init( &attr ), paInternalError );
    /* Priority relative to other processes */
    PA_UNLESS( !pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM ), paInternalError );   

    PA_UNLESS( !pthread_create( &self->thread, &attr, threadFunc, threadArg ), paInternalError );
    started = 1;

    if( rtSched )
    {
#if 0
        if( self->useWatchdog )
        {
            int err;
            struct sched_param wdSpm = { 0 };
            /* Launch watchdog, watchdog sets callback thread priority */
            int prio = PA_MIN( self->rtPrio + 4, sched_get_priority_max( SCHED_FIFO ) );
            wdSpm.sched_priority = prio;

            PA_UNLESS( !pthread_attr_init( &attr ), paInternalError );
            PA_UNLESS( !pthread_attr_setinheritsched( &attr, PTHREAD_EXPLICIT_SCHED ), paInternalError );
            PA_UNLESS( !pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM ), paInternalError );
            PA_UNLESS( !pthread_attr_setschedpolicy( &attr, SCHED_FIFO ), paInternalError );
            PA_UNLESS( !pthread_attr_setschedparam( &attr, &wdSpm ), paInternalError );
            if( (err = pthread_create( &self->watchdogThread, &attr, &WatchdogFunc, self )) )
            {
                PA_UNLESS( err == EPERM, paInternalError );
                /* Permission error, go on without realtime privileges */
                PA_DEBUG(( "Failed bumping priority\n" ));
            }
            else
            {
                int policy;
                self->watchdogRunning = 1;
                PA_ENSURE_SYSTEM( pthread_getschedparam( self->watchdogThread, &policy, &wdSpm ), 0 );
                /* Check if priority is right, policy could potentially differ from SCHED_FIFO (but that's alright) */
                if( wdSpm.sched_priority != prio )
                {
                    PA_DEBUG(( "Watchdog priority not set correctly (%d)\n", wdSpm.sched_priority ));
                    PA_ENSURE( paInternalError );
                }
            }
        }
        else
#endif
            PA_ENSURE( BoostPriority( self ) );

        {
            int policy;
            struct sched_param spm;
            pthread_getschedparam(self->thread, &policy, &spm);
        }
    }
    
    if( self->parentWaiting )
    {
        PaTime till;
        struct timespec ts;
        int res = 0;
        PaTime now;

        PA_ENSURE( PaUnixMutex_Lock( &self->mtx ) );

        /* Wait for stream to be started */
        now = PaUtil_GetTime();
        till = now + waitForChild;

        while( self->parentWaiting && !res )
        {
            if( waitForChild > 0 )
            {
                ts.tv_sec = (time_t) floor( till );
                ts.tv_nsec = (long) ((till - floor( till )) * 1e9);
                res = pthread_cond_timedwait( &self->cond, &self->mtx.mtx, &ts );
            }
            else
            {
                res = pthread_cond_wait( &self->cond, &self->mtx.mtx );
            }
        }

        PA_ENSURE( PaUnixMutex_Unlock( &self->mtx ) );

        PA_UNLESS( !res || ETIMEDOUT == res, paInternalError );
        PA_DEBUG(( "%s: Waited for %g seconds for stream to start\n", __FUNCTION__, PaUtil_GetTime() - now ));
        if( ETIMEDOUT == res )
        {
            PA_ENSURE( paTimedOut );
        }
    }

end:
    return result;
error:
    if( started )
    {
        PaUnixThread_Terminate( self, 0, NULL );
    }

    goto end;
}